

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.h
# Opt level: O0

uint __thiscall
FFlatVertexBuffer::GetCount(FFlatVertexBuffer *this,FFlatVertex *newptr,uint *poffset)

{
  uint uVar1;
  uint uVar2;
  uint diff;
  uint newofs;
  uint *poffset_local;
  FFlatVertex *newptr_local;
  FFlatVertexBuffer *this_local;
  
  uVar2 = (uint)(((long)newptr - (long)this->map) / 0x14);
  uVar1 = this->mCurIndex;
  *poffset = this->mCurIndex;
  this->mCurIndex = uVar2;
  if (0x1e828b < this->mCurIndex) {
    this->mCurIndex = this->mIndex;
  }
  return uVar2 - uVar1;
}

Assistant:

unsigned int GetCount(FFlatVertex *newptr, unsigned int *poffset)
	{
		unsigned int newofs = (unsigned int)(newptr - map);
		unsigned int diff = newofs - mCurIndex;
		*poffset = mCurIndex;
		mCurIndex = newofs;
		if (mCurIndex >= BUFFER_SIZE_TO_USE) mCurIndex = mIndex;
		return diff;
	}